

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

float __thiscall
duckdb::Interpolator<false>::Operation<float,float,duckdb::MadAccessor<float,float,float>>
          (Interpolator<false> *this,float *v_t,Vector *result,
          MadAccessor<float,_float,_float> *accessor)

{
  idx_t iVar1;
  long lVar2;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<float,_float,_float>_>_> __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<float,_float,_float>_>_> __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<float,_float,_float>_>_> __comp_01;
  bool bVar3;
  ulong uVar4;
  idx_t iVar5;
  InvalidInputException *pIVar6;
  idx_t iVar7;
  duckdb *pdVar8;
  idx_t iVar9;
  float fVar10;
  float result_1;
  float local_6c;
  string local_68;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  bVar3 = this->desc;
  iVar7 = this->CRN;
  iVar9 = this->FRN;
  iVar1 = this->begin;
  iVar5 = this->end;
  local_68._M_dataplus._M_p = (pointer)accessor;
  local_68._M_string_length = (size_type)accessor;
  local_68.field_2._M_local_buf[0] = bVar3;
  if (iVar7 == iVar9) {
    if (iVar7 != iVar5 && iVar1 != iVar5) {
      uVar4 = (long)(iVar5 * 4 + iVar1 * -4) >> 2;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_68.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar3;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<float*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<float,float,float>>>>
                (v_t + iVar1,v_t + iVar7,v_t + iVar5,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
      iVar7 = this->FRN;
    }
    fVar10 = ABS(v_t[iVar7] - *accessor->median);
    local_48 = ZEXT416((uint)fVar10);
    pdVar8 = (duckdb *)0x0;
    bVar3 = TryCast::Operation<float,float>(fVar10,&local_6c,false);
    if (!bVar3) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,float>(&local_68,pdVar8,(float)local_48._0_4_);
      InvalidInputException::InvalidInputException(pIVar6,&local_68);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (iVar9 != iVar5 && iVar1 != iVar5) {
      uVar4 = (long)(iVar5 * 4 + iVar1 * -4) >> 2;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_68.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar3;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<float*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<float,float,float>>>>
                (v_t + iVar1,v_t + iVar9,v_t + iVar5,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
      iVar9 = this->FRN;
      iVar7 = this->CRN;
      iVar5 = this->end;
    }
    local_68._M_dataplus._M_p = (pointer)accessor;
    local_68._M_string_length = (size_type)accessor;
    local_68.field_2._M_local_buf[0] = bVar3;
    if (iVar7 != iVar5 && iVar9 != iVar5) {
      uVar4 = (long)(iVar5 * 4 + iVar9 * -4) >> 2;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_68.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar3;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<float*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<float,float,float>>>>
                (v_t + iVar9,v_t + iVar7,v_t + iVar5,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
      iVar9 = this->FRN;
    }
    fVar10 = ABS(v_t[iVar9] - *accessor->median);
    local_48 = ZEXT416((uint)fVar10);
    pdVar8 = (duckdb *)0x0;
    bVar3 = TryCast::Operation<float,float>(fVar10,&local_6c,false);
    if (!bVar3) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,float>(&local_68,pdVar8,(float)local_48._0_4_);
      InvalidInputException::InvalidInputException(pIVar6,&local_68);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_48._0_4_ = local_6c;
    fVar10 = ABS(v_t[this->CRN] - *accessor->median);
    local_38 = ZEXT416((uint)fVar10);
    pdVar8 = (duckdb *)0x0;
    bVar3 = TryCast::Operation<float,float>(fVar10,&local_6c,false);
    if (!bVar3) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<float,float>(&local_68,pdVar8,(float)local_38._0_4_);
      InvalidInputException::InvalidInputException(pIVar6,&local_68);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_6c = (float)((double)(local_6c - (float)local_48._0_4_) *
                       (this->RN -
                       (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                        1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                      (double)(float)local_48._0_4_);
  }
  return local_6c;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}